

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::protos::gen::PerfEventConfig_CallstackSampling::~PerfEventConfig_CallstackSampling
          (PerfEventConfig_CallstackSampling *this)

{
  ~PerfEventConfig_CallstackSampling(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

PerfEventConfig_CallstackSampling::~PerfEventConfig_CallstackSampling() = default;